

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTTClient.cpp
# Opt level: O0

ErrorType __thiscall Network::Client::MQTTv5::eventLoop(MQTTv5 *this)

{
  bool bVar1;
  Type TVar2;
  ErrorType local_6c;
  int local_68;
  ErrorType ret;
  int ret_1;
  int ret_3;
  PingRespPacket rpacket;
  undefined1 local_38 [8];
  PingReqPacket packet;
  ControlPacketType type;
  MQTTv5 *this_local;
  ErrorType ret_2;
  
  bVar1 = ImplBase<Network::Client::MQTTv5::Impl>::isOpen
                    (&this->impl->super_ImplBase<Network::Client::MQTTv5::Impl>);
  if (!bVar1) {
    ErrorType::ErrorType((ErrorType *)((long)&this_local + 4),NotConnected);
    return (ErrorType)this_local._4_4_;
  }
  packet.super_PingTemplate<(Protocol::MQTT::Common::ControlPacketType)12>._20_4_ =
       ImplBase<Network::Client::MQTTv5::Impl>::getLastPacketType
                 (&this->impl->super_ImplBase<Network::Client::MQTTv5::Impl>);
  if (packet.super_PingTemplate<(Protocol::MQTT::Common::ControlPacketType)12>._20_4_ == RESERVED) {
    bVar1 = ImplBase<Network::Client::MQTTv5::Impl>::shouldPing
                      (&this->impl->super_ImplBase<Network::Client::MQTTv5::Impl>);
    if (bVar1) {
      ImplBase<Network::Client::MQTTv5::Impl>::setConnectionState
                (&this->impl->super_ImplBase<Network::Client::MQTTv5::Impl>,Pinging);
      Protocol::MQTT::V5::ControlPacket<(Protocol::MQTT::Common::ControlPacketType)12,_false>::
      ControlPacket((ControlPacket<(Protocol::MQTT::Common::ControlPacketType)12,_false> *)local_38)
      ;
      this_local._4_4_ =
           ImplBase<Network::Client::MQTTv5::Impl>::requestOneLoop
                     (&this->impl->super_ImplBase<Network::Client::MQTTv5::Impl>,
                      (ControlPacketSerializable *)local_38);
      TVar2 = ErrorType::operator_cast_to_Type((ErrorType *)((long)&this_local + 4));
      if (TVar2 == Success) {
        packet.super_PingTemplate<(Protocol::MQTT::Common::ControlPacketType)12>._20_4_ =
             ImplBase<Network::Client::MQTTv5::Impl>::getLastPacketType
                       (&this->impl->super_ImplBase<Network::Client::MQTTv5::Impl>);
        if (packet.super_PingTemplate<(Protocol::MQTT::Common::ControlPacketType)12>._20_4_ ==
            PINGRESP) {
          Protocol::MQTT::V5::ControlPacket<(Protocol::MQTT::Common::ControlPacketType)13,_false>::
          ControlPacket((ControlPacket<(Protocol::MQTT::Common::ControlPacketType)13,_false> *)
                        &ret_1);
          ret.errorCode =
               ImplBase<Network::Client::MQTTv5::Impl>::extractControlPacket
                         (&this->impl->super_ImplBase<Network::Client::MQTTv5::Impl>,
                          packet.super_PingTemplate<(Protocol::MQTT::Common::ControlPacketType)12>.
                          _20_4_,(Serializable *)&ret_1);
          rpacket.super_PingTemplate<(Protocol::MQTT::Common::ControlPacketType)13>.header.
          super_FixedHeaderBase.typeAndFlags = ret.errorCode < 1;
          if ((bool)rpacket.super_PingTemplate<(Protocol::MQTT::Common::ControlPacketType)13>.header
                    .super_FixedHeaderBase.typeAndFlags) {
            ErrorType::ErrorType((ErrorType *)((long)&this_local + 4),NetworkError);
          }
          rpacket.super_PingTemplate<(Protocol::MQTT::Common::ControlPacketType)13>._17_3_ = 0;
          Protocol::MQTT::V5::ControlPacket<(Protocol::MQTT::Common::ControlPacketType)13,_false>::
          ~ControlPacket((ControlPacket<(Protocol::MQTT::Common::ControlPacketType)13,_false> *)
                         &ret_1);
          if (rpacket.super_PingTemplate<(Protocol::MQTT::Common::ControlPacketType)13>._16_4_ != 0)
          goto LAB_00130f51;
        }
        ErrorType::ErrorType((ErrorType *)((long)&this_local + 4),Success);
        rpacket.super_PingTemplate<(Protocol::MQTT::Common::ControlPacketType)13>.header.
        super_FixedHeaderBase.typeAndFlags = '\x01';
        rpacket.super_PingTemplate<(Protocol::MQTT::Common::ControlPacketType)13>._17_3_ = 0;
      }
      else {
        rpacket.super_PingTemplate<(Protocol::MQTT::Common::ControlPacketType)13>.header.
        super_FixedHeaderBase.typeAndFlags = '\x01';
        rpacket.super_PingTemplate<(Protocol::MQTT::Common::ControlPacketType)13>._17_3_ = 0;
      }
LAB_00130f51:
      Protocol::MQTT::V5::ControlPacket<(Protocol::MQTT::Common::ControlPacketType)12,_false>::
      ~ControlPacket((ControlPacket<(Protocol::MQTT::Common::ControlPacketType)12,_false> *)local_38
                    );
      return (ErrorType)this_local._4_4_;
    }
    local_68 = ImplBase<Network::Client::MQTTv5::Impl>::receiveControlPacket
                         (&this->impl->super_ImplBase<Network::Client::MQTTv5::Impl>,true);
    if (local_68 == 0) {
      ImplBase<Network::Client::MQTTv5::Impl>::close
                (&this->impl->super_ImplBase<Network::Client::MQTTv5::Impl>,0x80);
      ErrorType::ErrorType((ErrorType *)((long)&this_local + 4),NotConnected);
      return (ErrorType)this_local._4_4_;
    }
    if (local_68 == -2) {
      ErrorType::ErrorType((ErrorType *)((long)&this_local + 4),Success);
      return (ErrorType)this_local._4_4_;
    }
    if (local_68 < 0) {
      ErrorType::ErrorType((ErrorType *)((long)&this_local + 4),NetworkError);
      return (ErrorType)this_local._4_4_;
    }
    packet.super_PingTemplate<(Protocol::MQTT::Common::ControlPacketType)12>._20_4_ =
         ImplBase<Network::Client::MQTTv5::Impl>::getLastPacketType
                   (&this->impl->super_ImplBase<Network::Client::MQTTv5::Impl>);
  }
  local_6c.errorCode =
       (int32)ImplBase<Network::Client::MQTTv5::Impl>::dealWithNoise
                        (&this->impl->super_ImplBase<Network::Client::MQTTv5::Impl>);
  TVar2 = ErrorType::operator_cast_to_Type(&local_6c);
  if (TVar2 == TranscientPacket) {
    ErrorType::ErrorType((ErrorType *)((long)&this_local + 4),Success);
  }
  else {
    this_local._4_4_ = local_6c.errorCode;
  }
  return (ErrorType)this_local._4_4_;
}

Assistant:

MQTTv5::ErrorType MQTTv5::eventLoop()
    {
        if (!impl->isOpen()) return ErrorType::NotConnected;

        // Check if we have a packet ready for reading now
        Protocol::MQTT::Common::ControlPacketType type = impl->getLastPacketType();
        if (type == Protocol::MQTT::V5::RESERVED)
        {
            // Check if we need to ping the server
            if (impl->shouldPing())
            {
                // Create a Ping request packet and send it
                impl->setConnectionState(State::Pinging);
                Protocol::MQTT::V5::PingReqPacket packet;
                if (ErrorType ret = impl->requestOneLoop(packet))
                    return ret;

                type = impl->getLastPacketType();
                if (type == Protocol::MQTT::V5::PINGRESP)
                {
                    Protocol::MQTT::V5::PingRespPacket rpacket;
                    int ret = impl->extractControlPacket(type, rpacket);
                    if (ret <= 0) return ErrorType::NetworkError;
                }
                // Ok, done for now
                return ErrorType::Success;
            }
            // Check the server for any packet...
            int ret = impl->receiveControlPacket(true);
            if (ret == 0)
            {
                impl->close();
                return ErrorType::NotConnected;
            }
            // No answer in time, it's not an error here
            if (ret == -2) return ErrorType::Success;
            if (ret < 0)   return ErrorType::NetworkError;
            // Ok, now we have a packet read it
            type = impl->getLastPacketType();
        }

        ErrorType ret = impl->dealWithNoise();
        if (ret == ErrorType::TranscientPacket)
            return ErrorType::Success;

        return ret;
    }